

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.h
# Opt level: O1

void __thiscall TPZMHMeshControl::TPZMHMeshControl(TPZMHMeshControl *this,int dimension)

{
  TPZAutoPointer<TPZGeoMesh> *this_00;
  _Rb_tree_header *p_Var1;
  _Rep_type *p_Var2;
  TPZReference *pTVar3;
  TPZReference *pTVar4;
  TPZGeoMesh *this_01;
  TPZCompMesh *pTVar5;
  
  this->_vptr_TPZMHMeshControl = (_func_int **)&PTR__TPZMHMeshControl_01a08528;
  this_00 = &this->fGMesh;
  pTVar3 = (TPZReference *)operator_new(0x10);
  pTVar3->fPointer = (TPZGeoMesh *)0x0;
  (pTVar3->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar3->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fGMesh).fRef = pTVar3;
  pTVar4 = (TPZReference *)operator_new(0x10);
  pTVar4->fPointer = (TPZCompMesh *)0x0;
  (pTVar4->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar4->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fCMesh).fRef = pTVar4;
  pTVar4 = (TPZReference *)operator_new(0x10);
  pTVar4->fPointer = (TPZCompMesh *)0x0;
  (pTVar4->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar4->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fCMeshLagrange).fRef = pTVar4;
  pTVar4 = (TPZReference *)operator_new(0x10);
  pTVar4->fPointer = (TPZCompMesh *)0x0;
  (pTVar4->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar4->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fCMeshConstantPressure).fRef = pTVar4;
  pTVar4 = (TPZReference *)operator_new(0x10);
  pTVar4->fPointer = (TPZCompMesh *)0x0;
  (pTVar4->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar4->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fPressureFineMesh).fRef = pTVar4;
  this->fProblemType = EScalar;
  this->fNState = 1;
  this->fSkeletonMatId = 4;
  this->fSecondSkeletonMatId = 3;
  this->fPressureSkeletonMatId = 6;
  this->fLagrangeMatIdLeft = 0x226;
  this->fLagrangeMatIdRight = 0x227;
  p_Var1 = &(this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->fpOrderInternal = 1;
  this->fpOrderSkeleton = 1;
  this->fHdivmaismais = 0;
  this->fSkeletonWrapMatId = 500;
  this->fBoundaryWrapMatId = 0x1f6;
  this->fInternalWrapMatId = 0x1f5;
  TPZManVector<long,_10>::TPZManVector(&this->fGeoToMHMDomain,0);
  p_Var1 = &(this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &(this->fMHMtoSubCMesh)._M_t;
  (p_Var2->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (p_Var2->_M_impl).super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined1 (*) [16])
   &(this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->fMHMtoSubCMesh)._M_t._M_impl = (undefined1  [16])0x0;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->fInterfaces)._M_t._M_impl.super__Rb_tree_header;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined4 *)
   ((long)&(this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_node_count +
   7) = 0;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)&this->fGlobalSystemSize = 0xffffffff;
  *(undefined4 *)((long)&this->fGlobalSystemSize + 4) = 0xffffffff;
  *(undefined4 *)&this->fGlobalSystemWithLocalCondensationSize = 0xffffffff;
  *(undefined4 *)((long)&this->fGlobalSystemWithLocalCondensationSize + 4) = 0xffffffff;
  this->fNumeq = -1;
  this_01 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(this_01);
  TPZAutoPointer<TPZGeoMesh>::operator=(this_00,this_01);
  this_00->fRef->fPointer->fDim = dimension;
  pTVar5 = (TPZCompMesh *)operator_new(0x918);
  TPZCompMesh::TPZCompMesh(pTVar5,this_00,false);
  TPZAutoPointer<TPZCompMesh>::operator=(&this->fCMesh,pTVar5);
  pTVar5 = (TPZCompMesh *)operator_new(0x918);
  TPZCompMesh::TPZCompMesh(pTVar5,this_00,false);
  TPZAutoPointer<TPZCompMesh>::operator=(&this->fPressureFineMesh,pTVar5);
  return;
}

Assistant:

TPZMHMeshControl(int dimension) : fProblemType(EScalar), fNState(1), fGeoToMHMDomain(), fMHMtoSubCMesh(),
    fLagrangeAveragePressure(false),
    fHybridize(false), fSwitchLagrangeSign(false), fGlobalSystemSize(-1), fGlobalSystemWithLocalCondensationSize(-1), fNumeq(-1)
    {
        fGMesh = new TPZGeoMesh;
        fGMesh->SetDimension(dimension);
        fCMesh = new TPZCompMesh(fGMesh);
        fPressureFineMesh = new TPZCompMesh(fGMesh);
    }